

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

int __thiscall
jaegertracing::net::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  sockaddr *__src;
  int iVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  _Head_base<0UL,_addrinfo_*,_false> _Var3;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> result;
  ostringstream oss;
  string asStack_1e8 [32];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_1c8;
  ostream local_1a0;
  
  iVar2._0_2_ = __addr[4].sa_family;
  iVar2._2_1_ = __addr[4].sa_data[0];
  iVar2._3_1_ = __addr[4].sa_data[1];
  resolveAddress(&local_1c8,(string *)(__addr + 2),iVar2,2,
                 *(int *)(CONCAT44(in_register_00000034,__fd) + 0xc));
  _Var3._M_head_impl =
       local_1c8._M_t.super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
       super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
       super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl;
  while( true ) {
    if (_Var3._M_head_impl == (addrinfo *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a0,"Cannot connect socket to remote address ",0x28);
      URI::print<std::__cxx11::ostringstream>
                ((URI *)__addr,
                 (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_1a0);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1e8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = ::connect(*(int *)(CONCAT44(in_register_00000034,__fd) + 4),
                      (sockaddr *)(_Var3._M_head_impl)->ai_addr,(_Var3._M_head_impl)->ai_addrlen);
    if (iVar2 == 0) break;
    _Var3._M_head_impl = (_Var3._M_head_impl)->ai_next;
  }
  __src = (_Var3._M_head_impl)->ai_addr;
  uVar1 = (_Var3._M_head_impl)->ai_addrlen;
  *(undefined4 *)(this + 8) = 0x10;
  this->_osResource = (OSResource)0x0;
  *(undefined3 *)&this->field_0x1 = 0;
  this->_handle = 0;
  this->_family = 0;
  this->_type = 0;
  this[1]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[1].field_0x1 = 0;
  this[1]._handle = 0;
  this[1]._family = 0;
  this[1]._type = 0;
  this[2]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[2].field_0x1 = 0;
  this[2]._handle = 0;
  this[2]._family = 0;
  this[2]._type = 0;
  this[3]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[3].field_0x1 = 0;
  this[3]._handle = 0;
  this[3]._family = 0;
  this[3]._type = 0;
  this[4]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[4].field_0x1 = 0;
  this[4]._handle = 0;
  this[4]._family = 0;
  this[4]._type = 0;
  this[5]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[5].field_0x1 = 0;
  this[5]._handle = 0;
  this[5]._family = 0;
  this[5]._type = 0;
  this[6]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[6].field_0x1 = 0;
  this[6]._handle = 0;
  this[6]._family = 0;
  this[6]._type = 0;
  this[7]._osResource = (OSResource)0x0;
  *(undefined3 *)&this[7].field_0x1 = 0;
  this[7]._handle = 0;
  this[7]._family = 0;
  this[7]._type = 0;
  memcpy(this,__src,(ulong)uVar1);
  std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_1c8);
  return (int)this;
}

Assistant:

IPAddress connect(const URI& serverURI)
    {
        auto result =
            resolveAddress(serverURI._host, serverURI._port, AF_INET, _type);
        for (const auto* itr = result.get(); itr; itr = itr->ai_next) {
            const auto returnCode =
                ::connect(_handle, itr->ai_addr, itr->ai_addrlen);
            if (returnCode == 0) {
                return IPAddress(*itr->ai_addr, itr->ai_addrlen);
            }
        }
        std::ostringstream oss;
        oss << "Cannot connect socket to remote address ";
        serverURI.print(oss);
        throw std::runtime_error(oss.str());
    }